

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

void __thiscall
wallet::SelectionResult::AddInputs
          (SelectionResult *this,
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          *inputs,bool subtract_fee_outputs)

{
  long lVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  byte in_DL;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *unaff_retaddr;
  SelectionResult *in_stack_00000008;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  InsertInputs<std::set<std::shared_ptr<wallet::COutput>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>>
            (in_stack_00000008,unaff_retaddr);
  *(byte *)((long)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_color + 1) =
       ~(in_DL & 1) & 1;
  iVar3 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::cbegin(in_RDI);
  iVar4 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::cend(in_RDI);
  iVar2 = std::
          accumulate<std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>>,int,wallet::SelectionResult::AddInputs(std::set<std::shared_ptr<wallet::COutput>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>const&,bool)::__0>
                    (iVar3._M_node,iVar4._M_node,0);
  *(int *)&in_RDI[2]._M_t._M_impl = *(int *)&in_RDI[2]._M_t._M_impl + iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SelectionResult::AddInputs(const std::set<std::shared_ptr<COutput>>& inputs, bool subtract_fee_outputs)
{
    // As it can fail, combine inputs first
    InsertInputs(inputs);
    m_use_effective = !subtract_fee_outputs;

    m_weight += std::accumulate(inputs.cbegin(), inputs.cend(), 0, [](int sum, const auto& coin) {
        return sum + std::max(coin->input_bytes, 0) * WITNESS_SCALE_FACTOR;
    });
}